

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int getSubsamp(j_decompress_ptr dinfo)

{
  uint uVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  uVar1 = dinfo->num_components;
  if (((ulong)uVar1 != 1) || (iVar8 = 3, dinfo->jpeg_color_space != JCS_GRAYSCALE)) {
    iVar10 = uVar1 - 1;
    lVar11 = (ulong)uVar1 * 0x60 + -0x60;
    iVar8 = -1;
    lVar12 = 0;
    do {
      if ((uVar1 == pixelsize[lVar12]) ||
         (((uVar1 == 4 && (lVar12 != 3)) && ((dinfo->jpeg_color_space & ~JCS_GRAYSCALE) == JCS_CMYK)
          ))) {
        pjVar3 = dinfo->comp_info;
        iVar2 = pjVar3->h_samp_factor;
        iVar7 = tjMCUWidth[lVar12];
        iVar5 = iVar7 + 7;
        if (-1 < iVar7) {
          iVar5 = iVar7;
        }
        iVar5 = iVar5 >> 3;
        iVar7 = (int)lVar12;
        if (iVar2 == iVar5) {
          iVar14 = tjMCUHeight[lVar12];
          iVar15 = iVar14 + 7;
          if (-1 < iVar14) {
            iVar15 = iVar14;
          }
          if (pjVar3->v_samp_factor == iVar15 >> 3) {
            iVar14 = 0;
            if (1 < (int)uVar1) {
              lVar9 = 0;
              iVar14 = 0;
              do {
                if (dinfo->jpeg_color_space == JCS_YCCK) {
                  iVar15 = 1;
                  iVar6 = 1;
                  if (lVar9 == 0xc0) {
LAB_0010ec34:
                    iVar15 = iVar2;
                    iVar6 = pjVar3->v_samp_factor;
                  }
                }
                else {
                  iVar15 = 1;
                  iVar6 = 1;
                  if (lVar9 == 0xc0 && dinfo->jpeg_color_space == JCS_CMYK) goto LAB_0010ec34;
                }
                if (*(int *)((long)&pjVar3[1].h_samp_factor + lVar9) == iVar15) {
                  iVar14 = iVar14 + (uint)(*(int *)((long)&pjVar3[1].v_samp_factor + lVar9) == iVar6
                                          );
                }
                lVar9 = lVar9 + 0x60;
              } while (lVar11 != lVar9);
            }
            if (iVar14 == iVar10) {
              return iVar7;
            }
          }
        }
        iVar14 = pjVar3->v_samp_factor;
        if ((iVar14 == 2 && iVar2 == 2) && ((iVar14 = 2, iVar7 == 4 || (iVar7 == 1)))) {
          iVar15 = 0;
          if (1 < (int)uVar1) {
            iVar15 = tjMCUHeight[lVar12];
            iVar6 = iVar15 + 7;
            if (-1 < iVar15) {
              iVar6 = iVar15;
            }
            lVar9 = 0;
            iVar15 = 0;
            do {
              iVar13 = iVar6 >> 3;
              iVar4 = iVar5;
              if (dinfo->jpeg_color_space == JCS_YCCK) {
                if (lVar9 == 0xc0) {
LAB_0010ed03:
                  iVar13 = 2;
                  iVar4 = 2;
                }
              }
              else if (lVar9 == 0xc0 && dinfo->jpeg_color_space == JCS_CMYK) goto LAB_0010ed03;
              if (*(int *)((long)&pjVar3[1].h_samp_factor + lVar9) == iVar13) {
                iVar15 = iVar15 + (uint)(*(int *)((long)&pjVar3[1].v_samp_factor + lVar9) == iVar4);
              }
              lVar9 = lVar9 + 0x60;
            } while (lVar11 != lVar9);
          }
          if (iVar15 == iVar10) {
            return iVar7;
          }
        }
        if ((lVar12 == 0 && 1 < (int)uVar1) && iVar14 * iVar2 <= (int)(10 / (long)pixelsize[lVar12])
           ) {
          lVar9 = 0;
          iVar7 = 0;
          do {
            if (*(int *)((long)&pjVar3[1].h_samp_factor + lVar9) == iVar2) {
              iVar7 = iVar7 + (uint)(*(int *)((long)&pjVar3[1].v_samp_factor + lVar9) == iVar14);
            }
            if (iVar7 == iVar10) {
              iVar8 = 0;
              break;
            }
            lVar9 = lVar9 + 0x60;
          } while (lVar11 != lVar9);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
  }
  return iVar8;
}

Assistant:

static int getSubsamp(j_decompress_ptr dinfo)
{
  int retval = -1, i, k;

  /* The sampling factors actually have no meaning with grayscale JPEG files,
     and in fact it's possible to generate grayscale JPEGs with sampling
     factors > 1 (even though those sampling factors are ignored by the
     decompressor.)  Thus, we need to treat grayscale as a special case. */
  if (dinfo->num_components == 1 && dinfo->jpeg_color_space == JCS_GRAYSCALE)
    return TJSAMP_GRAY;

  for (i = 0; i < NUMSUBOPT; i++) {
    if (dinfo->num_components == pixelsize[i] ||
        ((dinfo->jpeg_color_space == JCS_YCCK ||
          dinfo->jpeg_color_space == JCS_CMYK) &&
         pixelsize[i] == 3 && dinfo->num_components == 4)) {
      if (dinfo->comp_info[0].h_samp_factor == tjMCUWidth[i] / 8 &&
          dinfo->comp_info[0].v_samp_factor == tjMCUHeight[i] / 8) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = 1, vref = 1;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = tjMCUWidth[i] / 8;  vref = tjMCUHeight[i] / 8;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:2:2 and 4:4:0 images whose sampling factors are specified
         in non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor == 2 &&
          dinfo->comp_info[0].v_samp_factor == 2 &&
          (i == TJSAMP_422 || i == TJSAMP_440)) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = tjMCUHeight[i] / 8, vref = tjMCUWidth[i] / 8;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = vref = 2;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:4:4 images whose sampling factors are specified in
         non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor *
          dinfo->comp_info[0].v_samp_factor <=
          D_MAX_BLOCKS_IN_MCU / pixelsize[i] && i == TJSAMP_444) {
        int match = 0;
        for (k = 1; k < dinfo->num_components; k++) {
          if (dinfo->comp_info[k].h_samp_factor ==
              dinfo->comp_info[0].h_samp_factor &&
              dinfo->comp_info[k].v_samp_factor ==
              dinfo->comp_info[0].v_samp_factor)
            match++;
          if (match == dinfo->num_components - 1) {
            retval = i;  break;
          }
        }
      }
    }
  }
  return retval;
}